

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O3

int ilu_sQuerySpace(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = sp_ienv(1);
  lVar2 = (long)L->ncol;
  fVar3 = (float)L->ncol;
  fVar4 = (float)iVar1;
  fVar5 = (fVar3 + 1.0) * 4.0 + (float)*(int *)(*(long *)((long)U->Store + 0x18) + lVar2 * 4) * 12.0
          + (float)*(int *)(*(long *)((long)L->Store + 0x20) + lVar2 * 4) * 4.0 +
            (fVar3 * 4.0 + 3.0) * 4.0 +
            (float)*(int *)(*(long *)((long)L->Store + 0x10) + lVar2 * 4) * 8.0;
  mem_usage->for_lu = fVar5;
  mem_usage->total_needed =
       (fVar4 + fVar4 + 9.0 + 3.0) * fVar3 * 4.0 + (fVar4 + 1.0) * fVar3 * 8.0 + fVar5;
  return 0;
}

Assistant:

int ilu_sQuerySpace(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage)
{
    SCformat *Lstore;
    NCformat *Ustore;
    register int n, panel_size = sp_ienv(1);
    register float iword, dword;

    Lstore = L->Store;
    Ustore = U->Store;
    n = L->ncol;
    iword = sizeof(int);
    dword = sizeof(double);

    /* For LU factors */
    mem_usage->for_lu = (float)( (4.0f * n + 3.0f) * iword +
				 Lstore->nzval_colptr[n] * dword +
				 Lstore->rowind_colptr[n] * iword );
    mem_usage->for_lu += (float)( (n + 1.0f) * iword +
				 Ustore->colptr[n] * (dword + iword) );

    /* Working storage to support factorization.
       ILU needs 5*n more integers than LU */
    mem_usage->total_needed = mem_usage->for_lu +
	(float)( (2.0f * panel_size + 9.0f + NO_MARKER) * n * iword +
		(panel_size + 1.0f) * n * dword );

    return 0;
}